

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  size_t sVar2;
  undefined8 *p;
  sqlite3_module *psVar3;
  sqlite3_vtab *psVar4;
  char **ppcVar5;
  int extraout_EDX;
  int iVar6;
  int extraout_EDX_00;
  uint uVar7;
  undefined8 *puVar8;
  sqlite3 *psVar9;
  sqlite3_vtab **ppsVar10;
  char **ppcVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  sqlite3_tokenizer *pTok;
  char **local_50;
  sqlite3_vtab **local_48;
  ulong local_40;
  Fts3Hash *local_38;
  
  pTok = (sqlite3_tokenizer *)0x0;
  ppcVar5 = argv;
  ppsVar10 = ppVtab;
  ppcVar11 = pzErr;
  iVar1 = sqlite3_declare_vtab(db,"CREATE TABLE x(input, token, start, end, position)");
  if (iVar1 != 0) {
    return iVar1;
  }
  p = (undefined8 *)0x0;
  uVar7 = argc - 3;
  local_40 = (ulong)(uint)argc;
  local_38 = (Fts3Hash *)pHash;
  if (uVar7 == 0) {
LAB_0017707a:
    pcVar14 = "simple";
  }
  else {
    iVar1 = 7;
    uVar13 = 0;
    if (0 < (int)uVar7) {
      uVar13 = (ulong)uVar7;
    }
    local_50 = pzErr;
    local_48 = ppVtab;
    for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      sVar2 = strlen(argv[uVar12 + 3]);
      p = (undefined8 *)(ulong)((int)p + (int)sVar2 + 1);
    }
    p = (undefined8 *)sqlite3_malloc((int)p + uVar7 * 8);
    if (p == (undefined8 *)0x0) {
      p = (undefined8 *)0x0;
      goto LAB_0017712b;
    }
    pcVar14 = (char *)(p + (int)uVar7);
    for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      sVar2 = strlen(argv[uVar12 + 3]);
      p[uVar12] = pcVar14;
      sVar2 = (size_t)((int)sVar2 + 1);
      memcpy(pcVar14,argv[uVar12 + 3],sVar2);
      sqlite3Fts3Dequote(pcVar14);
      pcVar14 = pcVar14 + sVar2;
    }
    argc = (int)local_40;
    ppVtab = local_48;
    pzErr = local_50;
    if (argc < 4) goto LAB_0017707a;
    pcVar14 = (char *)*p;
  }
  sVar2 = strlen(pcVar14);
  psVar3 = (sqlite3_module *)sqlite3Fts3HashFind(local_38,pcVar14,(int)sVar2 + 1);
  if (psVar3 == (sqlite3_module *)0x0) {
    pcVar14 = sqlite3_mprintf("unknown tokenizer: %s",pcVar14);
    *pzErr = pcVar14;
    iVar1 = 1;
  }
  else {
    puVar8 = p + 1;
    psVar9 = (sqlite3 *)0x0;
    if (4 < argc) {
      psVar9 = (sqlite3 *)(ulong)(argc - 4);
    }
    iVar1 = (*psVar3->xCreate)(psVar9,puVar8,(int)&pTok,ppcVar5,ppsVar10,ppcVar11);
    iVar6 = extraout_EDX;
    if (iVar1 == 0) {
      psVar4 = (sqlite3_vtab *)sqlite3_malloc(0x28);
      if (psVar4 != (sqlite3_vtab *)0x0) {
        psVar4->pModule = (sqlite3_module *)0x0;
        *(undefined8 *)&psVar4->nRef = 0;
        psVar4->zErrMsg = (char *)0x0;
        psVar4[1].pModule = psVar3;
        *(sqlite3_tokenizer **)&psVar4[1].nRef = pTok;
        *ppVtab = psVar4;
        iVar1 = 0;
        goto LAB_0017712b;
      }
      iVar1 = 7;
      iVar6 = extraout_EDX_00;
    }
    if (pTok != (sqlite3_tokenizer *)0x0) {
      (*psVar3->xConnect)((sqlite3 *)pTok,puVar8,iVar6,ppcVar5,ppsVar10,ppcVar11);
    }
  }
LAB_0017712b:
  sqlite3_free(p);
  return iVar1;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}